

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Integrate.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Integrate::ChFunction_Integrate
          (ChFunction_Integrate *this,ChFunction_Integrate *other)

{
  double *pdVar1;
  double *pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  int iVar14;
  Index size;
  undefined4 extraout_var;
  Index index;
  ulong uVar15;
  long lVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Integrate_00b6c870;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  iVar14 = (*((other->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_30,(ChFunction *)CONCAT44(extraout_var,iVar14));
  _Var13._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var,iVar14);
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  this->order = other->order;
  this->C_start = other->C_start;
  this->x_start = other->x_start;
  this->x_end = other->x_end;
  this->num_samples = other->num_samples;
  pdVar3 = (other->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar15 = (other->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar15) {
    Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,uVar15
               ,1);
  }
  uVar4 = (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar4 == uVar15) {
    pdVar5 = (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    uVar15 = uVar4 + 7;
    if (-1 < (long)uVar4) {
      uVar15 = uVar4;
    }
    uVar15 = uVar15 & 0xfffffffffffffff8;
    if (7 < (long)uVar4) {
      lVar16 = 0;
      do {
        pdVar1 = pdVar3 + lVar16;
        dVar6 = pdVar1[1];
        dVar7 = pdVar1[2];
        dVar8 = pdVar1[3];
        dVar9 = pdVar1[4];
        dVar10 = pdVar1[5];
        dVar11 = pdVar1[6];
        dVar12 = pdVar1[7];
        pdVar2 = pdVar5 + lVar16;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        pdVar2[2] = dVar7;
        pdVar2[3] = dVar8;
        pdVar2[4] = dVar9;
        pdVar2[5] = dVar10;
        pdVar2[6] = dVar11;
        pdVar2[7] = dVar12;
        lVar16 = lVar16 + 8;
      } while (lVar16 < (long)uVar15);
    }
    if ((long)uVar15 < (long)uVar4) {
      do {
        pdVar5[uVar15] = pdVar3[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar4 != uVar15);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Array<double, -1, 1>, SrcXprType = Eigen::Array<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

ChFunction_Integrate::ChFunction_Integrate(const ChFunction_Integrate& other) {
    fa = std::shared_ptr<ChFunction>(other.fa->Clone());
    order = other.order;
    C_start = other.C_start;
    x_start = other.x_start;
    x_end = other.x_end;
    num_samples = other.num_samples;
    array_x = other.array_x;
}